

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::error<unsigned_int&,unsigned_long,std::__cxx11::string,unsigned_long>
          (ValidationContext *this,IssueError *issue,uint *args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          unsigned_long *args_3)

{
  char *pcVar1;
  string_view fmt;
  format_args args_00;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  ulong local_78 [2];
  unsigned_long local_68;
  pointer local_58;
  size_type sStack_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_48;
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_c0[0] = (issue->super_Issue).type;
  local_c0._2_2_ = (issue->super_Issue).id;
  pcVar1 = (issue->super_Issue).message._M_str;
  local_b8._M_p = (pointer)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,pcVar1,pcVar1 + (issue->super_Issue).message._M_len);
  local_78[0] = (ulong)*args;
  local_68 = *args_1;
  local_58 = (args_2->_M_dataplus)._M_p;
  sStack_50 = args_2->_M_string_length;
  local_48 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )*args_3;
  fmt.size_ = 0x4d42;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
          )local_48.values_;
  args_00.desc_ = (unsigned_long_long)local_78;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_98,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->callback)._M_invoker)((_Any_data *)&this->callback,(ValidationReport *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }